

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::aboutToRemoveCell(QTextDocumentPrivate *this,int from,int to)

{
  long lVar1;
  bool bVar2;
  const_iterator *this_00;
  QTextCursorPrivate **ppQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QTextCursorPrivate *curs;
  add_const_t<QSet<QTextCursorPrivate_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  int in_stack_00000048;
  int in_stack_0000004c;
  QTextCursorPrivate *in_stack_00000050;
  QTextCursorPrivate *in_stack_ffffffffffffffb8;
  QSet<QTextCursorPrivate_*> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (const_iterator *)(in_RDI + 0x170);
  QSet<QTextCursorPrivate_*>::begin(in_stack_ffffffffffffffd8);
  QSet<QTextCursorPrivate_*>::end((QSet<QTextCursorPrivate_*> *)&DAT_aaaaaaaaaaaaaaaa);
  while( true ) {
    bVar2 = QSet<QTextCursorPrivate_*>::const_iterator::operator!=
                      (this_00,(const_iterator *)in_stack_ffffffffffffffb8);
    if (!bVar2) break;
    ppQVar3 = QSet<QTextCursorPrivate_*>::const_iterator::operator*((const_iterator *)0x7d746f);
    in_stack_ffffffffffffffb8 = *ppQVar3;
    QTextCursorPrivate::aboutToRemoveCell(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    QSet<QTextCursorPrivate_*>::const_iterator::operator++(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::aboutToRemoveCell(int from, int to)
{
    Q_ASSERT(from <= to);
    for (QTextCursorPrivate *curs : std::as_const(cursors))
        curs->aboutToRemoveCell(from, to);
}